

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O2

brick_volume * idx2::GetBrickVolume(brick_volume *__return_storage_ptr__,brick_pool *Bp,v3i *Brick3)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  unsigned_long *Key;
  idx2_file *piVar6;
  byte *pbVar7;
  i64 iVar8;
  allocator *paVar9;
  u64 uVar10;
  u64 uVar11;
  undefined7 uVar12;
  i8 iVar13;
  i8 iVar14;
  bool bVar15;
  undefined4 uVar16;
  int iVar17;
  u64 uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint in_R8D;
  int iVar24;
  uint uVar25;
  int iVar26;
  bool bVar27;
  v3i Brick3_00;
  v3i Brick3_01;
  u64 AKey;
  iterator AbIt;
  ulong uVar23;
  
  Brick3_00.field_0.field_0.Y = 0;
  Brick3_00.field_0.field_0.X = (Brick3->field_0).field_0.Z;
  Brick3_00.field_0.field_0.Z = in_R8D;
  uVar23 = (ulong)in_R8D;
  uVar18 = GetLinearBrick((idx2 *)Bp->Idx2,(idx2_file *)0x0,(int)*(undefined8 *)&Brick3->field_0,
                          Brick3_00);
  Key = (unsigned_long *)(Bp->ResolutionLevels).Buffer.Data;
  bVar1 = *(byte *)((long)Key + uVar18);
  uVar22 = (uint)(char)bVar1;
  if (bVar1 == 0) {
    AKey = uVar18 << 4;
    Lookup<unsigned_long,idx2::brick_volume>
              (&AbIt,(idx2 *)Bp,(hash_table<unsigned_long,_idx2::brick_volume> *)&AKey,Key);
    piVar6 = Bp->Idx2;
    uVar22 = (piVar6->BrickDimsExt3).field_0.field_0.X;
    uVar25 = (piVar6->BrickDimsExt3).field_0.field_0.Y;
    uVar5 = (piVar6->BrickDimsExt3).field_0.field_0.Z;
    ((AbIt.Val)->ExtentLocal).From = 0;
    ((AbIt.Val)->ExtentLocal).Dims =
         (ulong)(uVar5 & 0x1fffff) << 0x2a |
         ((ulong)uVar25 & 0x1fffff) << 0x15 | (ulong)uVar22 & 0x1fffff;
    iVar8 = ((AbIt.Val)->Vol).Buffer.Bytes;
    paVar9 = ((AbIt.Val)->Vol).Buffer.Alloc;
    uVar18 = ((AbIt.Val)->Vol).Dims;
    (__return_storage_ptr__->Vol).Buffer.Data = ((AbIt.Val)->Vol).Buffer.Data;
    (__return_storage_ptr__->Vol).Buffer.Bytes = iVar8;
    (__return_storage_ptr__->Vol).Buffer.Alloc = paVar9;
    (__return_storage_ptr__->Vol).Dims = uVar18;
    uVar12 = *(undefined7 *)&((AbIt.Val)->Vol).field_0x21;
    uVar18 = ((AbIt.Val)->ExtentLocal).From;
    (__return_storage_ptr__->Vol).Type = ((AbIt.Val)->Vol).Type;
    *(undefined7 *)&(__return_storage_ptr__->Vol).field_0x21 = uVar12;
    (__return_storage_ptr__->ExtentLocal).From = uVar18;
    (__return_storage_ptr__->ExtentLocal).Dims = ((AbIt.Val)->ExtentLocal).Dims;
    iVar13 = (AbIt.Val)->NChildrenMax;
    bVar27 = (AbIt.Val)->Significant;
    bVar15 = (AbIt.Val)->DoneDecoding;
    uVar16 = *(undefined4 *)&(AbIt.Val)->field_0x3c;
    __return_storage_ptr__->NChildrenDecoded = (AbIt.Val)->NChildrenDecoded;
    __return_storage_ptr__->NChildrenMax = iVar13;
    __return_storage_ptr__->Significant = bVar27;
    __return_storage_ptr__->DoneDecoding = bVar15;
    *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar16;
  }
  else {
    piVar6 = Bp->Idx2;
    uVar25 = 0;
    if ('\0' < (char)bVar1) {
      uVar25 = uVar22;
    }
    iVar26 = 1;
    iVar17 = 1;
    iVar20 = 1;
    while( true ) {
      bVar27 = uVar25 == 0;
      uVar25 = uVar25 - 1;
      if (bVar27) break;
      iVar17 = (piVar6->GroupBrick3).field_0.field_0.X * iVar17;
      iVar20 = iVar20 * (piVar6->GroupBrick3).field_0.field_0.Y;
      iVar26 = iVar26 * (piVar6->GroupBrick3).field_0.field_0.Z;
    }
    Brick3_01.field_0._0_8_ = (long)(Brick3->field_0).field_0.Z / (long)iVar26 & 0xffffffff;
    Brick3_01.field_0._8_4_ = (undefined4)uVar23;
    uVar18 = GetLinearBrick((idx2 *)piVar6,(idx2_file *)(ulong)uVar22,
                            (Brick3->field_0).field_0.X / iVar17,Brick3_01);
    AKey = (long)(int)uVar22 + uVar18 * 0x10;
    Lookup<unsigned_long,idx2::brick_volume>
              (&AbIt,(idx2 *)Bp,(hash_table<unsigned_long,_idx2::brick_volume> *)&AKey,
               (unsigned_long *)AKey);
    iVar2 = (Brick3->field_0).field_0.X;
    iVar3 = (Brick3->field_0).field_0.Y;
    iVar4 = (Brick3->field_0).field_0.Z;
    piVar6 = Bp->Idx2;
    iVar21 = 1 << (bVar1 & 0x1f);
    iVar19 = (piVar6->BrickDims3).field_0.field_0.X / iVar21;
    iVar24 = (piVar6->BrickDims3).field_0.field_0.Y / iVar21;
    iVar21 = (piVar6->BrickDims3).field_0.field_0.Z / iVar21;
    pbVar7 = ((AbIt.Val)->Vol).Buffer.Data;
    iVar8 = ((AbIt.Val)->Vol).Buffer.Bytes;
    paVar9 = ((AbIt.Val)->Vol).Buffer.Alloc;
    uVar18 = ((AbIt.Val)->Vol).Dims;
    uVar12 = *(undefined7 *)&((AbIt.Val)->Vol).field_0x21;
    uVar10 = ((AbIt.Val)->ExtentLocal).From;
    uVar11 = ((AbIt.Val)->ExtentLocal).Dims;
    iVar13 = (AbIt.Val)->NChildrenDecoded;
    iVar14 = (AbIt.Val)->NChildrenMax;
    bVar27 = (AbIt.Val)->Significant;
    bVar15 = (AbIt.Val)->DoneDecoding;
    uVar16 = *(undefined4 *)&(AbIt.Val)->field_0x3c;
    (__return_storage_ptr__->Vol).Type = ((AbIt.Val)->Vol).Type;
    *(undefined7 *)&(__return_storage_ptr__->Vol).field_0x21 = uVar12;
    (__return_storage_ptr__->ExtentLocal).From = uVar10;
    (__return_storage_ptr__->ExtentLocal).Dims = uVar11;
    __return_storage_ptr__->NChildrenDecoded = iVar13;
    __return_storage_ptr__->NChildrenMax = iVar14;
    __return_storage_ptr__->Significant = bVar27;
    __return_storage_ptr__->DoneDecoding = bVar15;
    *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar16;
    (__return_storage_ptr__->Vol).Buffer.Data = pbVar7;
    (__return_storage_ptr__->Vol).Buffer.Bytes = iVar8;
    (__return_storage_ptr__->Vol).Buffer.Alloc = paVar9;
    (__return_storage_ptr__->Vol).Dims = uVar18;
    (__return_storage_ptr__->ExtentLocal).From =
         (ulong)((iVar4 % iVar26) * iVar21 & 0x1fffff) << 0x2a |
         (ulong)((iVar3 % iVar20) * iVar24 & 0x1fffff) << 0x15 |
         (ulong)((iVar2 % iVar17) * iVar19 & 0x1fffff);
    (__return_storage_ptr__->ExtentLocal).Dims =
         (ulong)((uint)(1 < iVar21) + iVar21 & 0x1fffff) << 0x2a |
         (ulong)((uint)(1 < iVar24) + iVar24 & 0x1fffff) << 0x15 |
         (ulong)((uint)(1 < iVar19) + iVar19 & 0x1fffff);
    __return_storage_ptr__->Significant = false;
  }
  return __return_storage_ptr__;
}

Assistant:

brick_volume
GetBrickVolume(brick_pool* Bp, const v3i& Brick3)
{
  const i8 Level = 0;
  u64 BrickIndex = GetLinearBrick(*Bp->Idx2, Level, Brick3);
  i8 Resolution = Bp->ResolutionLevels[BrickIndex];

  if (Resolution == 0)
  {
    u64 BrickKey = GetBrickKey(Level, BrickIndex);
    auto BrickIt = Lookup(Bp->BrickTable, BrickKey);
    idx2_Assert(BrickIt);
    BrickIt.Val->ExtentLocal = extent(Bp->Idx2->BrickDimsExt3);
    return *BrickIt.Val;
  }

  /* if resolution > 0, we need to find the ancestor */
  v3i GroupBrick3 = Pow(Bp->Idx2->GroupBrick3, Resolution);
  v3i ABrick3 = Brick3 / GroupBrick3;
  u64 ABrick = GetLinearBrick(*Bp->Idx2, Resolution, ABrick3);
  u64 AKey = GetBrickKey(Resolution, ABrick);
  auto AbIt = Lookup(Bp->BrickTable, AKey);
  idx2_Assert(AbIt);
  v3i D3 = Dims(AbIt.Val->Vol);
  v3i E3 = Dims(AbIt.Val->ExtentLocal);

  v3i LocalBrickPos3 = Brick3 % GroupBrick3;
  v3i BrickDims3 = (Bp->Idx2->BrickDims3 / (1 << Resolution));
  v3i BrickDimsExt3 = idx2_ExtDims(BrickDims3);
  brick_volume BrickVol = *AbIt.Val;
  BrickVol.ExtentLocal = extent(LocalBrickPos3 * BrickDims3, BrickDimsExt3);
  BrickVol.Significant = false;
  // BrickVol.NChildrenMax or NChildrenDecoded?

  return BrickVol;
}